

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDebugTests.cpp
# Opt level: O3

TestCaseGroup *
deqp::gles31::Functional::createChildCases
          (CaseType type,Context *ctx,char *name,char *desc,
          vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
          *funcs)

{
  undefined4 uVar1;
  char *name_00;
  char *desc_00;
  TestContext *pTVar2;
  TestNode *this;
  pointer pFVar3;
  BaseCase *this_00;
  undefined **ppuVar4;
  ulong uVar5;
  long lVar6;
  
  this = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup((TestCaseGroup *)this,ctx->m_testCtx,name,desc);
  pFVar3 = (funcs->
           super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((funcs->
      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
      )._M_impl.super__Vector_impl_data._M_finish != pFVar3) {
    lVar6 = 0x18;
    uVar5 = 0;
    do {
      name_00 = *(char **)((long)pFVar3 + lVar6 + -8);
      desc_00 = *(char **)((long)&(pFVar3->function).m_type + lVar6);
      uVar1 = *(undefined4 *)((long)pFVar3 + lVar6 + -0x18);
      pTVar2 = *(TestContext **)((long)pFVar3 + lVar6 + -0x10);
      if (type == CASETYPE_GETERROR) {
        this_00 = (BaseCase *)operator_new(0xd8);
        anon_unknown_1::BaseCase::BaseCase(this_00,ctx,name_00,desc_00);
        (this_00->super_ErrorCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
             (_func_int **)&PTR__BaseCase_00b26fe0;
        *(undefined4 *)
         &this_00[1].super_ErrorCase.super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
             uVar1;
        this_00[1].super_ErrorCase.super_TestCase.super_TestCase.super_TestNode.m_testCtx = pTVar2;
      }
      else {
        if (type == CASETYPE_LOG) {
          this_00 = (BaseCase *)operator_new(0x108);
          anon_unknown_1::BaseCase::BaseCase(this_00,ctx,name_00,desc_00);
          ppuVar4 = &PTR__LogErrorCase_00b26f78;
        }
        else {
          this_00 = (BaseCase *)operator_new(0x108);
          anon_unknown_1::BaseCase::BaseCase(this_00,ctx,name_00,desc_00);
          ppuVar4 = &PTR__CallbackErrorCase_00b26ea8;
        }
        (this_00->super_ErrorCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
             (_func_int **)ppuVar4;
        *(undefined4 *)
         &this_00[1].super_ErrorCase.super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
             uVar1;
        this_00[1].super_ErrorCase.super_TestCase.super_TestCase.super_TestNode.m_testCtx = pTVar2;
        this_00[1].super_ErrorCase.super_TestCase.super_TestCase.super_TestNode.m_name._M_dataplus.
        _M_p = (pointer)0x0;
        this_00[1].super_ErrorCase.super_TestCase.super_TestCase.super_TestNode.m_name.
        _M_string_length = 0;
        this_00[1].super_ErrorCase.super_TestCase.super_TestCase.super_TestNode.m_name.field_2.
        _M_allocated_capacity =
             (size_type)
             &this_00[1].super_ErrorCase.super_TestCase.super_TestCase.super_TestNode.m_description;
        *(undefined8 *)
         ((long)&this_00[1].super_ErrorCase.super_TestCase.super_TestCase.super_TestNode.m_name.
                 field_2 + 8) = 0;
        *(undefined1 *)
         &this_00[1].super_ErrorCase.super_TestCase.super_TestCase.super_TestNode.m_description.
          _M_dataplus._M_p = 0;
      }
      tcu::TestNode::addChild(this,(TestNode *)this_00);
      uVar5 = uVar5 + 1;
      pFVar3 = (funcs->
               super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
               )._M_impl.super__Vector_impl_data._M_start;
      lVar6 = lVar6 + 0x20;
    } while (uVar5 < (ulong)((long)(funcs->
                                   super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                                   )._M_impl.super__Vector_impl_data._M_finish - (long)pFVar3 >> 5))
    ;
  }
  return (TestCaseGroup *)this;
}

Assistant:

tcu::TestCaseGroup* createChildCases (CaseType type, Context& ctx, const char* name, const char* desc, const vector<FunctionContainer>& funcs)
{
	tcu::TestCaseGroup* host = new tcu::TestCaseGroup(ctx.getTestContext(), name, desc);

	for (size_t ndx = 0; ndx < funcs.size(); ndx++)
			host->addChild(createCase(type, ctx, funcs[ndx].name, funcs[ndx].desc, funcs[ndx].function));

	return host;
}